

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmm.c
# Opt level: O0

void stmm_clean(stmm_table *table)

{
  int local_14;
  int i;
  stmm_table *table_local;
  
  for (local_14 = 0; local_14 < table->num_bins; local_14 = local_14 + 1) {
    table->bins[local_14] = (stmm_table_entry *)0x0;
  }
  table->num_entries = 0;
  Extra_MmFixedRestart((Extra_MmFixed_t *)table->pMemMan);
  return;
}

Assistant:

void
stmm_clean (stmm_table *table)
{
    int i;
    // clean the bins
    for (i = 0; i < table->num_bins; i++)
        table->bins[i] = NULL;
    // reset the parameters
    table->num_entries = 0;
    // restart the memory manager
    Extra_MmFixedRestart ((Extra_MmFixed_t *)table->pMemMan);
}